

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

Function * __thiscall Function::setYRange(Function *this,double min,double max,double step)

{
  double step_local;
  double max_local;
  double min_local;
  Function *this_local;
  
  this->dYMin = min;
  this->dYMax = max;
  this->dYStep = step;
  if (this->xLeft != (Function *)0x0) {
    (*(this->xLeft->super_Physical)._vptr_Physical[0xf])(min,max,step);
  }
  if (this->xRight != (Function *)0x0) {
    (*(this->xRight->super_Physical)._vptr_Physical[0xf])(min,max,step);
  }
  if (this->xPlus != (Function *)0x0) {
    (*(this->xPlus->super_Physical)._vptr_Physical[0xf])(min,max,step);
  }
  return this;
}

Assistant:

Function &Function::setYRange(double min, double max, double step)
{
	dYMin = min;
	dYMax = max;
	dYStep = step;
        if (xLeft) xLeft->setYRange(min, max, step);
        if (xRight) xRight->setYRange(min, max, step);
        if (xPlus) xPlus->setYRange(min, max, step);
	return *this;
}